

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O2

void HeapProfileTable::CleanupOldProfiles(char *prefix)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int i;
  pointer pcVar4;
  undefined1 local_c0 [8];
  glob_t g;
  string pattern;
  allocator<char> local_31;
  
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_cleanup_old_heap_profiles
      == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(pattern.field_2._M_local_buf + 8),prefix,&local_31);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&pattern.field_2 + 8),".*");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&g.gl_stat,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   ".heap");
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)(pattern.field_2._M_local_buf + 8));
    iVar1 = glob((char *)g.gl_stat,1,(__errfunc *)0x0,(glob_t *)local_c0);
    if ((iVar1 == 3) || (iVar1 == 0)) {
      sVar2 = strlen(prefix);
      for (pcVar4 = (pointer)0x0; pcVar4 < (ulong)local_c0; pcVar4 = pcVar4 + 1) {
        __s = *(char **)(g.gl_pathc + (long)pcVar4 * 8);
        sVar3 = strlen(__s);
        if ((ulong)(long)(int)sVar2 <= sVar3) {
          iVar1 = bcmp(__s,prefix,(long)(int)sVar2);
          if (iVar1 == 0) {
            RAW_VLOG(1,"Removing old heap profile %s",__s);
            unlink(__s);
          }
        }
      }
    }
    globfree((glob_t *)local_c0);
    std::__cxx11::string::~string((string *)&g.gl_stat);
  }
  return;
}

Assistant:

void HeapProfileTable::CleanupOldProfiles(const char* prefix) {
  if (!FLAGS_cleanup_old_heap_profiles)
    return;
  std::string pattern = std::string(prefix) + ".*" + kFileExt;
#if defined(HAVE_GLOB_H)
  glob_t g;
  const int r = glob(pattern.c_str(), GLOB_ERR, nullptr, &g);
  if (r == 0 || r == GLOB_NOMATCH) {
    const int prefix_length = strlen(prefix);
    for (int i = 0; i < g.gl_pathc; i++) {
      const char* fname = g.gl_pathv[i];
      if ((strlen(fname) >= prefix_length) &&
          (memcmp(fname, prefix, prefix_length) == 0)) {
        RAW_VLOG(1, "Removing old heap profile %s", fname);
        unlink(fname);
      }
    }
  }
  globfree(&g);
#else   /* HAVE_GLOB_H */
  RAW_LOG(WARNING, "Unable to remove old heap profiles (can't run glob())");
#endif
}